

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

recursive_directory_iterator * __thiscall
ghc::filesystem::recursive_directory_iterator::operator++(recursive_directory_iterator *this)

{
  element_type *peVar1;
  element_type *peVar2;
  long lVar3;
  filesystem_error *this_00;
  _Elt_pointer pdVar4;
  error_code ec_00;
  error_code ec;
  error_code local_68;
  path local_58;
  string local_38;
  
  local_68._M_value = 0;
  local_68._M_cat = (error_category *)std::_V2::system_category();
  increment(this,&local_68);
  if (local_68._M_value == 0) {
    return this;
  }
  this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_38,local_68._M_value);
  peVar1 = (this->_impl).
           super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pdVar4 = ((iterator *)
           ((long)&(peVar1->_dir_iter_stack).c.
                   super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                   ._M_impl + 0x30))->_M_cur;
  if (pdVar4 == ((iterator *)
                ((long)&(peVar1->_dir_iter_stack).c.
                        super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                        ._M_impl + 0x10))->_M_cur) {
    local_58._path._M_dataplus._M_p = (pointer)&local_58._path.field_2;
    local_58._path._M_string_length = 0;
    local_58._path.field_2._M_local_buf[0] = '\0';
  }
  else {
    if (pdVar4 == *(_Elt_pointer *)
                   ((long)&(peVar1->_dir_iter_stack).c.
                           super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                           ._M_impl + 0x38)) {
      pdVar4 = (*(_Map_pointer *)
                 ((long)&(peVar1->_dir_iter_stack).c.
                         super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                         ._M_impl + 0x48))[-1] + 0x20;
    }
    peVar2 = pdVar4[-1]._impl.
             super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_58._path._M_dataplus._M_p = (pointer)&local_58._path.field_2;
    lVar3 = *(long *)&(peVar2->_dir_entry)._path;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,lVar3,*(size_type *)((long)&peVar2->_dir_entry + 8) + lVar3);
  }
  ec_00._4_4_ = 0;
  ec_00._M_value = local_68._M_value;
  ec_00._M_cat = local_68._M_cat;
  filesystem_error::filesystem_error(this_00,&local_38,&local_58,ec_00);
  __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE recursive_directory_iterator& recursive_directory_iterator::operator++()
{
    std::error_code ec;
    increment(ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), _impl->_dir_iter_stack.empty() ? path() : _impl->_dir_iter_stack.top()->path(), ec);
    }
    return *this;
}